

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O3

void __thiscall
polyscope::render::ManagedBuffer<double>::ManagedBuffer
          (ManagedBuffer<double> *this,ManagedBufferRegistry *registry_,string *name_,
          vector<double,_std::allocator<double>_> *data_)

{
  pointer pcVar1;
  uint64_t uVar2;
  undefined1 auVar3 [64];
  
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0xc8);
  this->_vptr_ManagedBuffer = (_func_int **)0x5f2eb8;
  *(undefined8 *)&this->field_0xc8 = 0x5f2ee0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name_->_M_string_length);
  uVar2 = internal::getNextUniqueID();
  this->uniqueID = uVar2;
  this->registry = registry_;
  this->data = data_;
  this->dataGetsComputed = false;
  *(undefined8 *)&(this->computeFunc).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->computeFunc).super__Function_base._M_functor + 8) = 0;
  (this->computeFunc).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->computeFunc)._M_invoker = (_Invoker_type)0x0;
  auVar3 = ZEXT464(0) << 0x40;
  this->hostBufferIsPopulated = true;
  this->renderAttributeBuffer = (shared_ptr<polyscope::render::AttributeBuffer>)auVar3._0_16_;
  this->renderTextureBuffer = (shared_ptr<polyscope::render::TextureBuffer>)auVar3._16_16_;
  this->deviceBufferType = auVar3._32_4_;
  this->sizeX = auVar3._36_4_;
  this->sizeY = auVar3._40_4_;
  this->sizeZ = auVar3._44_4_;
  (this->existingIndexedViews).
  super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar3._48_8_;
  (this->existingIndexedViews).
  super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar3._56_8_;
  *(undefined1 (*) [64])
   &(this->renderTextureBuffer).
    super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       auVar3;
  if (registry_ != (ManagedBufferRegistry *)0x0) {
    ManagedBufferMap<double>::addManagedBuffer(&registry_->managedBufferMap_double,this);
  }
  return;
}

Assistant:

ManagedBuffer<T>::ManagedBuffer(ManagedBufferRegistry* registry_, const std::string& name_, std::vector<T>& data_)
    : name(name_), uniqueID(internal::getNextUniqueID()), registry(registry_), data(data_), dataGetsComputed(false),
      hostBufferIsPopulated(true) {

  if (registry) {
    registry->addManagedBuffer<T>(this);
  }
}